

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Stream Catch::createStream(string *streamName)

{
  bool bVar1;
  streambuf *psVar2;
  StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this;
  domain_error *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  Stream SVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *streamName_local;
  bool local_10;
  
  local_20 = streamName;
  bVar1 = std::operator==(streamName,"stdout");
  if (bVar1) {
    psVar2 = (streambuf *)std::ios::rdbuf();
    Stream::Stream((Stream *)&streamName_local,psVar2,false);
    uVar3 = extraout_RDX;
  }
  else {
    bVar1 = std::operator==(local_20,"stderr");
    if (bVar1) {
      psVar2 = (streambuf *)std::ios::rdbuf();
      Stream::Stream((Stream *)&streamName_local,psVar2,false);
      uVar3 = extraout_RDX_00;
    }
    else {
      bVar1 = std::operator==(local_20,"debug");
      if (!bVar1) {
        this_00 = (domain_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"Unknown stream: ",local_20);
        std::domain_error::domain_error(this_00,(string *)&local_50);
        __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      this = (StreamBufImpl<Catch::OutputDebugWriter,_256UL> *)operator_new(0x148);
      StreamBufImpl<Catch::OutputDebugWriter,_256UL>::StreamBufImpl(this);
      Stream::Stream((Stream *)&streamName_local,(streambuf *)this,true);
      uVar3 = extraout_RDX_01;
    }
  }
  SVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  SVar4.isOwned = local_10;
  SVar4.streamBuf = (streambuf *)streamName_local;
  return SVar4;
}

Assistant:

Stream createStream( const std::string& streamName ) {
        if( streamName == "stdout" ) return Stream( std::cout.rdbuf(), false );
        if( streamName == "stderr" ) return Stream( std::cerr.rdbuf(), false );
        if( streamName == "debug" ) return Stream( new StreamBufImpl<OutputDebugWriter>, true );

        throw std::domain_error( "Unknown stream: " + streamName );
    }